

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O1

void rlMultMatrixf(float *matf)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  Matrix *pMVar33;
  
  pMVar33 = RLGL.State.currentMatrix;
  fVar1 = matf[4];
  fVar2 = matf[8];
  fVar3 = matf[0xc];
  fVar4 = *matf;
  fVar5 = matf[1];
  fVar6 = matf[5];
  fVar7 = matf[9];
  fVar8 = matf[0xd];
  fVar9 = matf[6];
  fVar10 = (RLGL.State.currentMatrix)->m0;
  fVar11 = (RLGL.State.currentMatrix)->m1;
  fVar12 = (RLGL.State.currentMatrix)->m2;
  fVar13 = (RLGL.State.currentMatrix)->m3;
  fVar14 = matf[2];
  fVar15 = matf[10];
  fVar16 = matf[0xe];
  fVar17 = matf[7];
  fVar18 = matf[3];
  fVar19 = matf[0xb];
  fVar20 = matf[0xf];
  fVar21 = (RLGL.State.currentMatrix)->m5;
  fVar22 = (RLGL.State.currentMatrix)->m4;
  fVar23 = (RLGL.State.currentMatrix)->m6;
  fVar24 = (RLGL.State.currentMatrix)->m7;
  fVar25 = (RLGL.State.currentMatrix)->m9;
  fVar26 = (RLGL.State.currentMatrix)->m8;
  fVar27 = (RLGL.State.currentMatrix)->m10;
  fVar28 = (RLGL.State.currentMatrix)->m11;
  fVar29 = (RLGL.State.currentMatrix)->m13;
  fVar30 = (RLGL.State.currentMatrix)->m12;
  fVar31 = (RLGL.State.currentMatrix)->m14;
  fVar32 = (RLGL.State.currentMatrix)->m15;
  (RLGL.State.currentMatrix)->m0 = fVar13 * fVar3 + fVar12 * fVar2 + fVar10 * fVar4 + fVar1 * fVar11
  ;
  pMVar33->m4 = fVar24 * fVar3 + fVar23 * fVar2 + fVar22 * fVar4 + fVar1 * fVar21;
  pMVar33->m8 = fVar28 * fVar3 + fVar27 * fVar2 + fVar26 * fVar4 + fVar1 * fVar25;
  pMVar33->m12 = fVar3 * fVar32 + fVar2 * fVar31 + fVar4 * fVar30 + fVar1 * fVar29;
  pMVar33->m1 = fVar13 * fVar8 + fVar12 * fVar7 + fVar10 * fVar5 + fVar6 * fVar11;
  pMVar33->m5 = fVar24 * fVar8 + fVar23 * fVar7 + fVar22 * fVar5 + fVar6 * fVar21;
  pMVar33->m9 = fVar28 * fVar8 + fVar27 * fVar7 + fVar26 * fVar5 + fVar6 * fVar25;
  pMVar33->m13 = fVar8 * fVar32 + fVar7 * fVar31 + fVar5 * fVar30 + fVar6 * fVar29;
  pMVar33->m2 = fVar13 * fVar16 + fVar12 * fVar15 + fVar10 * fVar14 + fVar9 * fVar11;
  pMVar33->m6 = fVar24 * fVar16 + fVar23 * fVar15 + fVar22 * fVar14 + fVar9 * fVar21;
  pMVar33->m10 = fVar28 * fVar16 + fVar27 * fVar15 + fVar26 * fVar14 + fVar9 * fVar25;
  pMVar33->m14 = fVar16 * fVar32 + fVar15 * fVar31 + fVar14 * fVar30 + fVar9 * fVar29;
  pMVar33->m3 = fVar13 * fVar20 + fVar12 * fVar19 + fVar10 * fVar18 + fVar11 * fVar17;
  pMVar33->m7 = fVar24 * fVar20 + fVar23 * fVar19 + fVar22 * fVar18 + fVar21 * fVar17;
  pMVar33->m11 = fVar28 * fVar20 + fVar27 * fVar19 + fVar26 * fVar18 + fVar25 * fVar17;
  pMVar33->m15 = fVar32 * fVar20 + fVar31 * fVar19 + fVar30 * fVar18 + fVar17 * fVar29;
  return;
}

Assistant:

void rlMultMatrixf(float *matf)
{
    // Matrix creation from array
    Matrix mat = { matf[0], matf[4], matf[8], matf[12],
                   matf[1], matf[5], matf[9], matf[13],
                   matf[2], matf[6], matf[10], matf[14],
                   matf[3], matf[7], matf[11], matf[15] };

    *RLGL.State.currentMatrix = MatrixMultiply(*RLGL.State.currentMatrix, mat);
}